

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BranchAndBound.cpp
# Opt level: O3

SearchStatus __thiscall tsbp::TwoStepBranchingProcedure::Solve(TwoStepBranchingProcedure *this)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  pointer __first;
  SearchStatus SVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  int iVar12;
  double dVar10;
  undefined1 auVar11 [16];
  int iVar13;
  int iVar16;
  undefined1 auVar15 [16];
  vector<int,_std::allocator<int>_> itemOrder;
  allocator_type local_49;
  vector<int,_std::allocator<int>_> local_48;
  undefined1 auVar14 [16];
  
  lVar6 = std::chrono::_V2::steady_clock::now();
  iVar1 = (this->parameters).TSBPThreads;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_48,
             (long)(this->items).
                   super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->items).
                   super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>._M_impl.
                   super__Vector_impl_data._M_start >> 5,&local_49);
  __first = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start;
  auVar4 = _DAT_00139950;
  auVar3 = _DAT_00139900;
  auVar2 = _DAT_001398f0;
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    uVar7 = ((long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
            (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start) - 4;
    auVar15._8_4_ = (int)uVar7;
    auVar15._0_8_ = uVar7;
    auVar15._12_4_ = (int)(uVar7 >> 0x20);
    auVar11._0_8_ = uVar7 >> 2;
    auVar11._8_8_ = auVar15._8_8_ >> 2;
    uVar9 = 0;
    auVar11 = auVar11 ^ _DAT_00139900;
    do {
      iVar13 = (int)uVar9;
      auVar14._8_4_ = iVar13;
      auVar14._0_8_ = uVar9;
      auVar14._12_4_ = (int)(uVar9 >> 0x20);
      auVar15 = (auVar14 | auVar2) ^ auVar3;
      iVar12 = auVar11._4_4_;
      if ((bool)(~(auVar15._4_4_ == iVar12 && auVar11._0_4_ < auVar15._0_4_ ||
                  iVar12 < auVar15._4_4_) & 1)) {
        local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar9] = iVar13;
      }
      if ((auVar15._12_4_ != auVar11._12_4_ || auVar15._8_4_ <= auVar11._8_4_) &&
          auVar15._12_4_ <= auVar11._12_4_) {
        local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar9 + 1] = iVar13 + 1;
      }
      auVar15 = (auVar14 | auVar4) ^ auVar3;
      iVar16 = auVar15._4_4_;
      if (iVar16 <= iVar12 && (iVar16 != iVar12 || auVar15._0_4_ <= auVar11._0_4_)) {
        local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar9 + 2] = iVar13 + 2;
        local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar9 + 3] = iVar13 + 3;
      }
      uVar9 = uVar9 + 4;
    } while (((uVar7 >> 2) + 4 & 0xfffffffffffffffc) != uVar9);
    uVar7 = (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2;
    lVar8 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar8 == 0; lVar8 = lVar8 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<tsbp::CompareLexicographicDxDy>>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(ulong)(((uint)lVar8 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<tsbp::CompareLexicographicDxDy>)&this->items);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<tsbp::CompareLexicographicDxDy>>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__first,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,
               (_Iter_comp_iter<tsbp::CompareLexicographicDxDy>)&this->items);
  }
  std::vector<int,_std::allocator<int>_>::operator=(&this->branchingOrder,&local_48);
  if (iVar1 == 1) {
    SVar5 = SolveSequential(this);
    (this->statistics).NodeCountTSBP =
         ((long)(this->tree).super_type.m_vertices.
                super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->tree).super_type.m_vertices.
                super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
  }
  else if (iVar1 < 1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "Invalid number of threads parameter, solve in sequential mode.\n",0x3f);
    SVar5 = SolveSequential(this);
  }
  else {
    SVar5 = SolveParallelTaskflow(this);
  }
  lVar8 = std::chrono::_V2::steady_clock::now();
  dVar10 = (double)((lVar8 - lVar6) / 1000000);
  (this->statistics).TimeOverall = dVar10;
  (this->statistics).TimeTSBP = dVar10 - (this->statistics).TimeLMAO;
  dVar10 = MemoryUsedByCurrentProcess();
  (this->statistics).MemoryUsage = dVar10;
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return SVar5;
}

Assistant:

SearchStatus TwoStepBranchingProcedure::Solve()
{
    auto start = std::chrono::steady_clock::now();

    SearchStatus searchStatus = SearchStatus::None;
    int numberOfThreads = this->parameters.TSBPThreads;

    std::vector<int> itemOrder(items.size());
    std::iota(itemOrder.begin(), itemOrder.end(), 0);
    std::sort(itemOrder.begin(), itemOrder.end(), CompareLexicographicDxDy(&items));

    this->branchingOrder = itemOrder;

    if (numberOfThreads == 1)
    {
        searchStatus = SolveSequential();
        this->statistics.NodeCountTSBP = this->tree.m_vertices.size();
    }
    else if (numberOfThreads >= 1)
    {
        searchStatus = SolveParallelTaskflow();
        ////searchStatus = SolveParallelNative();
    }
    else
    {
        std::cout << "Invalid number of threads parameter, solve in sequential mode.\n";
        searchStatus = SolveSequential();
    }

    auto end = std::chrono::steady_clock::now();
    auto time = std::chrono::duration_cast<std::chrono::milliseconds>(end - start).count();

    this->statistics.TimeOverall = time;
    this->statistics.TimeTSBP = time - this->statistics.TimeLMAO;
    this->statistics.MemoryUsage = MemoryUsedByCurrentProcess();

    return searchStatus;
}